

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void __thiscall AMColorset::initFromCVars(AMColorset *this,FColorCVar **values)

{
  uint32 uVar1;
  uint uVar2;
  uint uVar3;
  int local_2c;
  int local_28;
  int b;
  int g;
  int r;
  DWORD ba;
  int i;
  FColorCVar **values_local;
  AMColorset *this_local;
  
  for (r = 0; r < 0x17; r = r + 1) {
    AMColor::FromCVar(this->c + r,values[r]);
  }
  uVar1 = FColorCVar::operator_cast_to_unsigned_int(*values);
  uVar2 = uVar1 >> 0x10 & 0xff;
  b = uVar2 - 0x10;
  uVar3 = uVar1 >> 8 & 0xff;
  local_28 = uVar3 - 0x10;
  local_2c = (uVar1 & 0xff) - 0x10;
  if (b < 0) {
    b = uVar2 + 0x10;
  }
  if (local_28 < 0) {
    local_28 = uVar3 + 0x10;
  }
  if (local_2c < 0) {
    local_2c = (uVar1 & 0xff) + 0x10;
  }
  AMColor::FromRGB(this->c + 0x17,b,local_28,local_2c);
  this->displayLocks = true;
  this->forcebackground = false;
  return;
}

Assistant:

void initFromCVars(FColorCVar **values)
	{
		for(int i=0;i<AlmostBackgroundColor; i++)
		{
			c[i].FromCVar(*values[i]);
		}

		DWORD ba = *(values[0]);

		int r = RPART(ba) - 16;
		int g = GPART(ba) - 16;
		int b = BPART(ba) - 16;

		if (r < 0)
			r += 32;
		if (g < 0)
			g += 32;
		if (b < 0)
			b += 32;

		c[AlmostBackgroundColor].FromRGB(r, g, b);
		displayLocks = true;
		forcebackground = false;
	}